

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O2

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
::_solve_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
           *this,MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *b,
          MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *dest)

{
  SparseMatrix<double,_0,_int> *lhs;
  Index IVar1;
  OtherCopy otherCopy;
  undefined1 local_38 [24];
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_20;
  
  if (*(int *)(this + 4) != 0) {
    return;
  }
  if (*(long *)(this + 0x90) < 1) {
    internal::call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)dest,(Matrix<double,__1,_1,_0,__1,_1> *)b);
  }
  else {
    local_38._0_8_ = this + 0x88;
    local_38._8_8_ = b;
    internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,2>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)dest,
               (Product<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2>
                *)local_38);
  }
  lhs = (SparseMatrix<double,_0,_int> *)(this + 0x10);
  IVar1 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::nonZeros
                    ((SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> *)lhs);
  if (0 < IVar1) {
    internal::
    sparse_solve_triangular_selector<const_Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_5,_1,_0>
    ::run(lhs,(Matrix<double,__1,_1,_0,__1,_1> *)dest);
  }
  if (0 < *(long *)(this + 0x60)) {
    local_38._8_8_ = this + 0x58;
    local_20 = dest;
    internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::Matrix<double,_1,1,0,_1,1>,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)dest,
               (Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                *)local_38);
  }
  IVar1 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::nonZeros
                    ((SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> *)lhs);
  if (0 < IVar1) {
    local_38._0_8_ = local_38._0_8_ & 0xffffffffffffff00;
    local_38._8_8_ = local_38._8_8_ & 0xffffffffffffff00;
    local_38._16_8_ = lhs;
    internal::
    sparse_solve_triangular_selector<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_6,_2,_1>
    ::run((Transpose<const_Eigen::SparseMatrix<double,_0,_int>_> *)(local_38 + 8),
          (Matrix<double,__1,_1,_0,__1,_1> *)dest);
  }
  if (0 < *(long *)(this + 0x90)) {
    local_38._0_8_ = this + 0x98;
    local_38._8_8_ = dest;
    internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,2>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)dest,
               (Product<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2>
                *)local_38);
  }
  return;
}

Assistant:

void _solve_impl(const MatrixBase<Rhs> &b, MatrixBase<Dest> &dest) const
    {
      eigen_assert(m_factorizationIsOk && "The decomposition is not in a valid state for solving, you must first call either compute() or symbolic()/numeric()");
      eigen_assert(m_matrix.rows()==b.rows());

      if(m_info!=Success)
        return;

      if(m_P.size()>0)
        dest = m_P * b;
      else
        dest = b;

      if(m_matrix.nonZeros()>0) // otherwise L==I
        derived().matrixL().solveInPlace(dest);

      if(m_diag.size()>0)
        dest = m_diag.asDiagonal().inverse() * dest;

      if (m_matrix.nonZeros()>0) // otherwise U==I
        derived().matrixU().solveInPlace(dest);

      if(m_P.size()>0)
        dest = m_Pinv * dest;
    }